

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::AssertionResult::swap(AssertionResult *this,AssertionResult *other)

{
  AssertionResult *other_local;
  AssertionResult *this_local;
  
  std::swap<bool>(&this->success_,&other->success_);
  std::swap<std::__cxx11::string,std::default_delete<std::__cxx11::string>>
            (&this->message_,&other->message_);
  return;
}

Assistant:

void AssertionResult::swap(AssertionResult& other) {
  using std::swap;
  swap(success_, other.success_);
  swap(message_, other.message_);
}